

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_LazyEmplaceL_Test::
~ParallelFlatHashSet_LazyEmplaceL_Test(ParallelFlatHashSet_LazyEmplaceL_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, LazyEmplaceL) {
    // --------------------
    // test lazy_emplace_l
    // --------------------
    using Set = phmap::THIS_HASH_SET<Entry>;
    Set m = { {1, 7}, {2, 9} };
 
    // insert a value that is not already present.
    // right now m[5] does not exist
    m.lazy_emplace_l(Entry{5}, 
                     [](Set::value_type& v) { v.value = 6; },            // called only when key was already present
                     [](const Set::constructor& ctor) { ctor(5, 13); }); // construct value_type in place when key not present 
    EXPECT_EQ(m.find(Entry{5})->value, 13);

    // change a value that is present. 
    m.lazy_emplace_l(Entry{5}, 
                     [](Set::value_type& v) { v.value = 6; },            // called only when key was already present
                     [](const Set::constructor& ctor) { ctor(5, 13); }); // construct value_type in place when key not present
    EXPECT_EQ(m.find(Entry{5})->value, 6);
}